

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O2

void __thiscall spvtools::opt::InstructionList::~InstructionList(InstructionList *this)

{
  ~InstructionList(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

InstructionList::~InstructionList() { clear(); }